

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkhash.c
# Opt level: O3

lh_table *
lh_table_new(int size,lh_entry_free_fn *free_fn,lh_hash_fn *hash_fn,lh_equal_fn *equal_fn)

{
  undefined1 auVar1 [16];
  lh_table *__ptr;
  lh_entry *plVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  long lVar6;
  
  if (size < 1) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/linkhash.c",
                  0x1fa,
                  "struct lh_table *lh_table_new(int, lh_entry_free_fn *, lh_hash_fn *, lh_equal_fn *)"
                 );
  }
  __ptr = (lh_table *)calloc(1,0x38);
  if (__ptr != (lh_table *)0x0) {
    __ptr->size = size;
    plVar2 = (lh_entry *)calloc((ulong)(uint)size,0x28);
    __ptr->table = plVar2;
    if (plVar2 != (lh_entry *)0x0) {
      __ptr->free_fn = free_fn;
      __ptr->hash_fn = hash_fn;
      __ptr->equal_fn = equal_fn;
      auVar1 = _DAT_0010c200;
      lVar3 = (ulong)(uint)size - 1;
      auVar4._8_4_ = (int)lVar3;
      auVar4._0_8_ = lVar3;
      auVar4._12_4_ = (int)((ulong)lVar3 >> 0x20);
      lVar3 = 0;
      auVar4 = auVar4 ^ _DAT_0010c200;
      auVar5 = _DAT_0010c1f0;
      do {
        auVar7 = auVar5 ^ auVar1;
        if ((bool)(~(auVar7._4_4_ == auVar4._4_4_ && auVar4._0_4_ < auVar7._0_4_ ||
                    auVar4._4_4_ < auVar7._4_4_) & 1)) {
          *(undefined8 *)((long)&plVar2->k + lVar3) = 0xffffffffffffffff;
        }
        if ((auVar7._12_4_ != auVar4._12_4_ || auVar7._8_4_ <= auVar4._8_4_) &&
            auVar7._12_4_ <= auVar4._12_4_) {
          *(undefined8 *)((long)&plVar2[1].k + lVar3) = 0xffffffffffffffff;
        }
        lVar6 = auVar5._8_8_;
        auVar5._0_8_ = auVar5._0_8_ + 2;
        auVar5._8_8_ = lVar6 + 2;
        lVar3 = lVar3 + 0x50;
      } while ((ulong)(size + 1U >> 1) * 0x50 != lVar3);
      return __ptr;
    }
    free(__ptr);
  }
  return (lh_table *)0x0;
}

Assistant:

struct lh_table *lh_table_new(int size, lh_entry_free_fn *free_fn, lh_hash_fn *hash_fn,
                              lh_equal_fn *equal_fn)
{
	int i;
	struct lh_table *t;

	/* Allocate space for elements to avoid divisions by zero. */
	assert(size > 0);
	t = (struct lh_table *)calloc(1, sizeof(struct lh_table));
	if (!t)
		return NULL;

	t->count = 0;
	t->size = size;
	t->table = (struct lh_entry *)calloc(size, sizeof(struct lh_entry));
	if (!t->table)
	{
		free(t);
		return NULL;
	}
	t->free_fn = free_fn;
	t->hash_fn = hash_fn;
	t->equal_fn = equal_fn;
	for (i = 0; i < size; i++)
		t->table[i].k = LH_EMPTY;
	return t;
}